

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

double __thiscall chrono::ChOptimizer::Eval_fx(ChOptimizer *this,double *x)

{
  long lVar1;
  ChVectorDynamic<> Vin;
  ChVectorDynamic<> Vout;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_38;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_28;
  double local_18;
  
  local_38.m_storage.m_data = (double *)0x0;
  local_38.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_38,(long)this->C_vars);
  local_28.m_storage.m_data = (double *)0x0;
  local_28.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_28,1);
  if (0 < local_38.m_storage.m_rows) {
    lVar1 = 0;
    do {
      local_38.m_storage.m_data[lVar1] = x[lVar1];
      lVar1 = lVar1 + 1;
    } while (local_38.m_storage.m_rows != lVar1);
  }
  (*(code *)**(undefined8 **)this->afunction)(this->afunction,&local_28,&local_38);
  this->fx_evaluations = this->fx_evaluations + 1;
  if (0 < local_28.m_storage.m_rows) {
    local_18 = *local_28.m_storage.m_data;
    free((void *)local_28.m_storage.m_data[-1]);
    if (local_38.m_storage.m_data != (double *)0x0) {
      free((void *)local_38.m_storage.m_data[-1]);
    }
    return local_18;
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

double ChOptimizer::Eval_fx(double x[]) {
    ChVectorDynamic<> Vin(C_vars);
    ChVectorDynamic<> Vout(1);

    for (int i = 0; i < Vin.size(); i++)
        Vin(i) = x[i];
    afunction->Eval(Vout, Vin);
    fx_evaluations++;
    return Vout(0);
}